

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_endpoint_refiner.cpp
# Opt level: O1

void __thiscall
crnlib::dxt_endpoint_refiner::optimize_dxt1
          (dxt_endpoint_refiner *this,vec3F *low_color,vec3F *high_color)

{
  void *pvVar1;
  params *ppVar2;
  uint8 *puVar3;
  ushort uVar4;
  void *pvVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  color_quad_u8 *pcVar9;
  byte bVar10;
  undefined1 *puVar11;
  ushort uVar12;
  uint16 color0;
  uint uVar13;
  ulong uVar14;
  undefined1 *puVar15;
  int iVar16;
  int iVar17;
  short sVar18;
  int iVar19;
  uint64 s;
  long lVar20;
  ushort uVar21;
  uint uVar23;
  uint uVar24;
  long lVar25;
  uint c;
  long lVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  bool bVar34;
  bool bVar35;
  uint uVar36;
  uint uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  uint uVar41;
  uint uVar44;
  undefined1 auVar42 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  vector<unsigned_int> solutions;
  uint64 hist [4];
  uint64 d [3];
  uint64 DD [4] [3];
  uint64 D2 [4] [3];
  color_quad_u8 block_colors [4];
  ushort local_1b0;
  ushort local_1ac;
  elemental_vector local_198;
  ulong local_188;
  ulong local_180;
  int local_178;
  uint local_174;
  ulong local_170;
  ulong local_168;
  dxt_endpoint_refiner *local_160;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  long local_128 [4];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  color_quad_u8 local_48 [6];
  short sVar22;
  undefined1 auVar40 [16];
  undefined1 auVar43 [16];
  
  uVar36 = (uint)(high_color->m_s[0] * 32.0);
  uVar37 = (uint)(low_color->m_s[1] * 64.0);
  uVar41 = -(uint)((int)uVar36 < 0x1f);
  uVar44 = -(uint)((int)uVar37 < 0x3f);
  uVar41 = ~uVar41 & 0x1f | uVar36 & uVar41;
  uVar36 = ~uVar44 & 0x3f | uVar37 & uVar44;
  uVar36 = -(uint)(0 < (int)uVar36) & uVar36;
  auVar39._0_4_ = (-(uint)(0 < (int)uVar41) & uVar41) << 0xb;
  auVar40._4_4_ = uVar36 << 0xb;
  auVar40._0_4_ = auVar39._0_4_;
  auVar40._8_4_ = auVar40._4_4_;
  auVar40._12_4_ = uVar36 << 5;
  auVar39._8_8_ = auVar40._8_8_;
  auVar39._4_4_ = uVar36 << 5;
  uVar36 = (uint)(high_color->m_s[1] * 64.0);
  uVar37 = (uint)(low_color->m_s[0] * 32.0);
  uVar41 = -(uint)((int)uVar36 < 0x3f);
  uVar44 = -(uint)((int)uVar37 < 0x1f);
  uVar41 = ~uVar41 & 0x3f | uVar36 & uVar41;
  uVar36 = ~uVar44 & 0x1f | uVar37 & uVar44;
  uVar36 = -(uint)(0 < (int)uVar36) & uVar36;
  auVar42._0_4_ = (-(uint)(0 < (int)uVar41) & uVar41) << 5;
  auVar43._4_4_ = uVar36 << 5;
  auVar43._0_4_ = auVar42._0_4_;
  auVar43._8_4_ = auVar43._4_4_;
  auVar43._12_4_ = uVar36 << 0xb;
  auVar42._8_8_ = auVar43._8_8_;
  auVar42._4_4_ = uVar36 << 0xb;
  auVar46._0_4_ = (int)(high_color->m_s[2] * 32.0);
  auVar46._4_4_ = (int)(low_color->m_s[2] * 32.0);
  auVar46._8_8_ = 0;
  auVar45._0_4_ = -(uint)(auVar46._0_4_ < (int)DAT_001ba7c0);
  auVar45._4_4_ = -(uint)(auVar46._4_4_ < DAT_001ba7c0._4_4_);
  auVar45._8_4_ = -(uint)(0 < DAT_001ba7c0._8_4_);
  auVar45._12_4_ = -(uint)(0 < DAT_001ba7c0._12_4_);
  auVar46 = ~auVar45 & _DAT_001ba7c0 | auVar46 & auVar45;
  auVar38._0_4_ = -(uint)(0 < auVar46._0_4_);
  auVar38._4_4_ = -(uint)(0 < auVar46._4_4_);
  auVar38._8_4_ = -(uint)(0 < auVar46._8_4_);
  auVar38._12_4_ = -(uint)(0 < auVar46._12_4_);
  auVar46 = auVar38 & auVar46 | auVar42 | auVar39;
  local_138 = (undefined1  [16])0x0;
  local_148 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  local_c8 = (undefined1  [16])0x0;
  local_d8 = (undefined1  [16])0x0;
  local_e8 = (undefined1  [16])0x0;
  local_f8 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  ppVar2 = this->m_pParams;
  uVar36 = ppVar2->m_num_pixels;
  if ((ulong)uVar36 != 0) {
    pcVar9 = ppVar2->m_pPixels;
    puVar3 = ppVar2->m_pSelectors;
    uVar14 = 0;
    do {
      bVar10 = puVar3[uVar14];
      *(long *)(local_148 + (ulong)bVar10 * 8) = *(long *)(local_148 + (ulong)bVar10 * 8) + 1;
      lVar20 = (ulong)bVar10 * 0x18;
      lVar25 = 0;
      do {
        bVar10 = (pcVar9->field_0).c[lVar25];
        *(ulong *)(local_a8 + lVar25 * 8 + lVar20) =
             *(long *)(local_a8 + lVar25 * 8 + lVar20) + (ulong)((uint)bVar10 * 2);
        *(ulong *)(local_108 + lVar25 * 8 + lVar20) =
             *(long *)(local_108 + lVar25 * 8 + lVar20) + (ulong)bVar10 * (ulong)bVar10;
        lVar25 = lVar25 + 1;
      } while (lVar25 != 3);
      uVar14 = uVar14 + 1;
      pcVar9 = pcVar9 + 1;
    } while (uVar14 != uVar36);
  }
  local_158 = pshuflw(auVar46,auVar46,0xe8);
  local_198.m_p = (void *)0x0;
  local_198.m_size = 0;
  local_198.m_capacity = 0;
  local_160 = this;
  elemental_vector::increase_capacity(&local_198,0x36,false,4,(object_mover)0x0,false);
  memset((void *)((ulong)local_198.m_size * 4 + (long)local_198.m_p),0,
         (ulong)(0x36 - local_198.m_size) << 2);
  local_198.m_size = 0x36;
  local_168 = local_138._0_8_ + local_148._0_8_;
  local_170 = local_138._8_8_ + local_148._8_8_;
  iVar8 = 8;
  do {
    uVar36 = (uint)(ushort)local_158._2_2_;
    uVar37 = uVar36 & 0x1f;
    sVar18 = (short)uVar37;
    uVar21 = sVar18 - 1;
    if (sVar18 == 0) {
      uVar21 = 0;
    }
    uVar14 = 0;
    pvVar5 = local_198.m_p;
    if (uVar21 <= (ushort)(sVar18 + 1U)) {
      uVar4 = (ushort)local_158._2_2_ >> 0xb;
      uVar41 = (ushort)local_158._2_2_ >> 5 & 0x3f;
      uVar14 = 0;
      sVar18 = (short)uVar41;
      uVar44 = (uint)(ushort)(sVar18 - 1);
      if (sVar18 == 0) {
        uVar44 = 0;
      }
      uVar12 = (uVar4 - 1) + (ushort)(uVar36 < 0x800);
      local_180 = CONCAT44(local_180._4_4_,(uint)uVar12);
      uVar23 = ((uint)(ushort)local_158._0_2_ * 0x10000 + (uint)uVar12 * 0x800 | uVar44 << 5) +
               (uint)uVar21;
      uVar30 = (uVar44 << 5 | (uint)uVar12 * 0x800) + (uint)uVar21;
      iVar16 = uVar36 - uVar30;
      uVar29 = (ulong)uVar21;
      do {
        local_188 = uVar29;
        local_1b0 = (ushort)uVar44;
        uVar24 = uVar23;
        uVar31 = uVar30;
        iVar17 = iVar16;
        uVar32 = uVar44;
        if (local_1b0 <= (ushort)(sVar18 + 1U)) {
          do {
            uVar29 = uVar14;
            uVar13 = (uint)uVar12;
            iVar19 = iVar17;
            uVar33 = uVar24;
            uVar27 = uVar31;
            if (uVar12 < 0x20 && uVar12 <= (ushort)(uVar4 + 1)) {
              do {
                uVar14 = uVar29;
                if (iVar19 != 0) {
                  uVar28 = uVar33 << 0x10 | uVar33 >> 0x10;
                  if ((ushort)local_158._0_2_ <= uVar27 && uVar27 != (ushort)local_158._0_2_) {
                    uVar28 = uVar33;
                  }
                  uVar14 = (ulong)((int)uVar29 + 1);
                  *(uint *)((long)local_198.m_p + uVar29 * 4) = uVar28;
                }
                if (uVar4 < uVar13) break;
                uVar33 = uVar33 + 0x800;
                iVar19 = iVar19 + -0x800;
                uVar27 = uVar27 + 0x800;
                bVar34 = uVar13 < 0x1f;
                uVar29 = uVar14;
                uVar13 = uVar13 + 1;
              } while (bVar34);
            }
            if (uVar41 < uVar32) break;
            uVar24 = uVar24 + 0x20;
            iVar17 = iVar17 + -0x20;
            uVar31 = uVar31 + 0x20;
            bVar34 = uVar32 < 0x3f;
            uVar32 = uVar32 + 1;
          } while (bVar34);
        }
        uVar24 = (uint)local_188;
        local_174 = uVar37;
        if (uVar37 < uVar24) break;
        uVar23 = uVar23 + 1;
        iVar16 = iVar16 + -1;
        uVar30 = uVar30 + 1;
        uVar29 = (ulong)(uVar24 + 1);
      } while (uVar24 < 0x1f);
    }
    uVar37 = local_158._0_4_ & 0x1f;
    sVar18 = (short)uVar37;
    uVar29 = (ulong)(ushort)(sVar18 - 1);
    if (sVar18 == 0) {
      uVar29 = 0;
    }
    if ((ushort)uVar29 <= (ushort)(sVar18 + 1U)) {
      uVar44 = local_158._0_4_ & 0xffff;
      uVar41 = uVar44 >> 5 & 0x3f;
      sVar18 = (short)uVar41;
      uVar23 = (uint)(ushort)(sVar18 - 1);
      if (sVar18 == 0) {
        uVar23 = 0;
      }
      sVar22 = (short)(uVar44 >> 0xb);
      uVar21 = sVar22 + -1 + (ushort)(uVar44 < 0x800);
      uVar30 = (uVar36 * 0x10000 + (uint)uVar21 * 0x800 | uVar23 << 5) + (int)uVar29;
      uVar24 = (uVar23 << 5 | (uint)uVar21 * 0x800) + (int)uVar29;
      iVar16 = uVar44 - uVar24;
      do {
        local_180 = uVar29;
        local_188 = CONCAT44(local_188._4_4_,iVar16);
        local_1ac = (ushort)uVar23;
        uVar32 = uVar24;
        iVar17 = iVar16;
        uVar33 = uVar23;
        uVar31 = uVar30;
        if (local_1ac <= (ushort)(sVar18 + 1U)) {
          do {
            uVar29 = uVar14;
            uVar13 = (uint)uVar21;
            iVar19 = iVar17;
            uVar27 = uVar31;
            uVar28 = uVar32;
            if (uVar21 < 0x20 && uVar21 <= (ushort)(sVar22 + 1U)) {
              do {
                uVar14 = uVar29;
                if (iVar19 != 0) {
                  uVar6 = uVar27 << 0x10 | uVar27 >> 0x10;
                  if (uVar36 < uVar28) {
                    uVar6 = uVar27;
                  }
                  uVar14 = (ulong)((int)uVar29 + 1);
                  *(uint *)((long)local_198.m_p + uVar29 * 4) = uVar6;
                }
                if (uVar44 >> 0xb < uVar13) break;
                uVar27 = uVar27 + 0x800;
                iVar19 = iVar19 + -0x800;
                uVar28 = uVar28 + 0x800;
                bVar34 = uVar13 < 0x1f;
                uVar29 = uVar14;
                uVar13 = uVar13 + 1;
              } while (bVar34);
            }
            if (uVar41 < uVar33) break;
            uVar31 = uVar31 + 0x20;
            iVar17 = iVar17 + -0x20;
            uVar32 = uVar32 + 0x20;
            bVar34 = uVar33 < 0x3f;
            uVar33 = uVar33 + 1;
          } while (bVar34);
        }
        uVar31 = (uint)local_180;
        if (uVar37 < uVar31) break;
        uVar30 = uVar30 + 1;
        iVar16 = iVar16 + -1;
        uVar24 = uVar24 + 1;
        uVar29 = (ulong)(uVar31 + 1);
      } while (uVar31 < 0x1f);
    }
    local_178 = iVar8;
    if ((int)uVar14 != 0) {
      pvVar1 = (void *)((long)local_198.m_p + uVar14 * 4);
      lVar20 = 0x3f;
      if (uVar14 != 0) {
        for (; uVar14 >> lVar20 == 0; lVar20 = lVar20 + -1) {
        }
      }
      std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_198.m_p,pvVar1,((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>(pvVar5,pvVar1);
    }
    bVar34 = uVar14 != 0;
    if (uVar14 == 0) {
      bVar10 = 0;
    }
    else {
      uVar29 = 0;
      bVar10 = 0;
      do {
        if ((uVar29 == 0) ||
           (*(int *)((long)local_198.m_p + uVar29 * 4) !=
            *(int *)((long)local_198.m_p + uVar29 * 4 + -4))) {
          uVar36 = *(uint *)((long)local_198.m_p + uVar29 * 4);
          uVar37 = uVar36 >> 0x10;
          if ((uVar36 & 0xffff) == uVar37) {
            if (local_170 < local_168) {
              uVar41 = (uint)((short)uVar36 == 0);
            }
            else {
              uVar44 = ~uVar36;
              uVar41 = 1;
              if (((uVar44 & 0x1f) == 0) && (uVar41 = 0x800, (uVar44 & 0xf800) == 0)) {
                uVar41 = (uint)((uVar44 & 0x7e0) != 0) << 5;
              }
            }
            if (local_170 < local_168) {
              iVar8 = -1;
              if (((uVar36 & 0x1f0000) == 0) && (iVar8 = -0x800, uVar36 < 0x8000000)) {
                iVar8 = (uint)(uVar36 < 0x10000) * 0x20 + -0x20;
              }
            }
            else {
              iVar8 = -(uint)(uVar37 == 0xffff);
            }
            uVar36 = uVar41 + uVar36;
            uVar37 = uVar37 + iVar8;
          }
          pcVar9 = local_48;
          color0 = (uint16)uVar36;
          dxt1_block::get_block_colors4(pcVar9,color0,(uint16)uVar37);
          bVar35 = local_160->m_pParams->m_perceptual;
          puVar11 = local_a8;
          puVar15 = local_108;
          lVar20 = 0;
          uVar7 = 0;
          do {
            lVar25 = *(long *)(local_148 + lVar20 * 8);
            lVar26 = 0;
            do {
              local_128[lVar26] =
                   (lVar25 * (ulong)(pcVar9->field_0).c[lVar26] - *(long *)(puVar11 + lVar26 * 8)) *
                   (ulong)(pcVar9->field_0).c[lVar26] + *(long *)(puVar15 + lVar26 * 8);
              lVar26 = lVar26 + 1;
            } while (lVar26 != 3);
            if (bVar35 == false) {
              lVar25 = local_128[0] + local_128[1];
            }
            else {
              lVar25 = local_128[1] * 0x19 + local_128[0] * 8;
            }
            uVar7 = uVar7 + lVar25 + local_128[2];
            lVar20 = lVar20 + 1;
            pcVar9 = pcVar9 + 1;
            puVar15 = puVar15 + 0x18;
            puVar11 = puVar11 + 0x18;
          } while (lVar20 != 4);
          bVar35 = true;
          if (uVar7 < local_160->m_pResults->m_error) {
            local_160->m_pResults->m_low_color = color0;
            local_160->m_pResults->m_high_color = (uint16)uVar37;
            local_160->m_pResults->m_error = uVar7;
            bVar35 = local_160->m_pResults->m_error != 0;
            if (bVar35) {
              bVar10 = 1;
            }
            local_158._8_8_ = 0;
            local_158._0_8_ = (ulong)uVar37 & 0xffffffff0000ffff | (ulong)color0 << 0x10;
          }
          if (!bVar35) break;
        }
        uVar29 = uVar29 + 1;
        bVar34 = uVar29 < uVar14;
      } while (uVar29 != uVar14);
    }
    if ((bVar34) || (iVar8 = local_178 + -1, !(bool)(bVar10 & iVar8 != 0))) {
      if (local_198.m_p != (void *)0x0) {
        crnlib_free(local_198.m_p);
      }
      return;
    }
  } while( true );
}

Assistant:

void dxt_endpoint_refiner::optimize_dxt1(vec3F low_color, vec3F high_color) {
  uint16 L0 = math::clamp<int>(low_color[0] * 32.0f, 0, 31) << 11 | math::clamp<int>(low_color[1] * 64.0f, 0, 63) << 5 | math::clamp<int>(low_color[2] * 32.0f, 0, 31);
  uint16 H0 = math::clamp<int>(high_color[0] * 32.0f, 0, 31) << 11 | math::clamp<int>(high_color[1] * 64.0f, 0, 63) << 5 | math::clamp<int>(high_color[2] * 32.0f, 0, 31);

  uint64 hist[4] = {}, D2[4][3] = {}, DD[4][3] = {};
  for (uint i = 0; i < m_pParams->m_num_pixels; i++) {
    const color_quad_u8& pixel = m_pParams->m_pPixels[i];
    uint8 s = m_pParams->m_pSelectors[i];
    hist[s]++;
    for (uint c = 0; c < 3; c++) {
      D2[s][c] += pixel[c] * 2;
      DD[s][c] += pixel[c] * pixel[c];
    }
  }
  crnlib::vector<uint> solutions(54);
  bool preserveL = hist[0] + hist[2] > hist[1] + hist[3];
  bool improved = true;

  for (uint iterations = 8; improved && iterations; iterations--) {
    improved = false;
    uint solutions_count = 0;
    for (uint16 b0 = L0 & 31, g0 = L0 >> 5 & 63, r0 = L0 >> 11 & 31, b = b0 ? b0 - 1 : b0; b <= b0 + 1 && b <= 31; b++) {
      for (uint16 g = g0 ? g0 - 1 : g0; g <= g0 + 1 && g <= 63; g++) {
        for (uint16 r = r0 ? r0 - 1 : r0; r <= r0 + 1 && r <= 31; r++) {
          uint16 L = r << 11 | g << 5 | b;
          if (L != L0)
            solutions[solutions_count++] = L > H0 ? L | H0 << 16 : H0 | L << 16;
        }
      }
    }
    for (uint16 b0 = H0 & 31, g0 = H0 >> 5 & 63, r0 = H0 >> 11 & 31, b = b0 ? b0 - 1 : b0; b <= b0 + 1 && b <= 31; b++) {
      for (uint16 g = g0 ? g0 - 1 : g0; g <= g0 + 1 && g <= 63; g++) {
        for (uint16 r = r0 ? r0 - 1 : r0; r <= r0 + 1 && r <= 31; r++) {
          uint16 H = r << 11 | g << 5 | b;
          if (H != H0)
            solutions[solutions_count++] = H > L0 ? H | L0 << 16 : L0 | H << 16;
        }
      }
    }
    std::sort(solutions.begin(), solutions.begin() + solutions_count);
    for (uint i = 0; i < solutions_count; i++) {
      if (i && solutions[i] == solutions[i - 1])
        continue;
      uint16 L = solutions[i] & 0xFFFF;
      uint16 H = solutions[i] >> 16;
      if (L == H) {
        L += !preserveL ? ~L & 0x1F ? 0x1 : ~L & 0xF800 ? 0x800 : ~L & 0x7E0 ? 0x20 : 0 : !L ? 0x1 : 0;
        H -= preserveL ? H & 0x1F ? 0x1 : H & 0xF800 ? 0x800 : H & 0x7E0 ? 0x20 : 0 : H == 0xFFFF ? 0x1 : 0;
      }
      color_quad_u8 block_colors[4];
      dxt1_block::get_block_colors4(block_colors, L, H);
      uint64 error = 0;
      for (uint64 s = 0, d[3]; s < 4; s++) {
        for (uint c = 0; c < 3; c++)
          d[c] = hist[s] * block_colors[s][c] * block_colors[s][c] - D2[s][c] * block_colors[s][c] + DD[s][c];
        error += m_pParams->m_perceptual ? d[0] * 8 + d[1] * 25 + d[2] : d[0] + d[1] + d[2];
      }
      if (error < m_pResults->m_error) {
        m_pResults->m_low_color = L0 = L;
        m_pResults->m_high_color = H0 = H;
        m_pResults->m_error = error;
        if (!m_pResults->m_error)
          return;
        improved = true;
      }
    }
  }
}